

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O2

XMLContentModel * __thiscall xercesc_4_0::DTDElementDecl::makeContentModel(DTDElementDecl *this)

{
  int iVar1;
  MixedContentModel *this_00;
  undefined4 extraout_var;
  XMLContentModel *pXVar2;
  RuntimeException *this_01;
  
  iVar1 = *(int *)&(this->super_XMLElementDecl).field_0x2c;
  if (iVar1 == 3) {
    pXVar2 = createChildModel(this);
    return pXVar2;
  }
  if (iVar1 == 2) {
    this_00 = (MixedContentModel *)
              XMemory::operator_new(0x30,(this->super_XMLElementDecl).fMemoryManager);
    iVar1 = (*(this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[9])(this);
    MixedContentModel::MixedContentModel
              (this_00,true,(ContentSpecNode *)CONCAT44(extraout_var,iVar1),false,
               (this->super_XMLElementDecl).fMemoryManager);
    return &this_00->super_XMLContentModel;
  }
  this_01 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDElementDecl.cpp"
             ,0x10c,CM_MustBeMixedOrChildren,(this->super_XMLElementDecl).fMemoryManager);
  __cxa_throw(this_01,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLContentModel* DTDElementDecl::makeContentModel()
{
    XMLContentModel* cmRet = 0;
    if (fModelType == Mixed_Simple)
    {
        //
        //  Just create a mixel content model object. This type of
        //  content model is optimized for mixed content validation.
        //
        cmRet = new (getMemoryManager()) MixedContentModel(true, this->getContentSpec(), false, getMemoryManager());
    }
     else if (fModelType == Children)
    {
        //
        //  This method will create an optimal model for the complexity
        //  of the element's defined model. If its simple, it will create
        //  a SimpleContentModel object. If its a simple list, it will
        //  create a SimpleListContentModel object. If its complex, it
        //  will create a DFAContentModel object.
        //
        cmRet = createChildModel();
    }
     else
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_MustBeMixedOrChildren, getMemoryManager());
    }
    return cmRet;
}